

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::genFilters
          (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
           *__return_storage_ptr__,FilterCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
          *messages,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *initial,deUint32 seed,int iterations)

{
  _Rb_tree_header *p_Var1;
  GLenum GVar2;
  GLenum type_;
  undefined4 uVar3;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *__x;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  pointer pMVar8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  pointer pMVar11;
  _Base_ptr p_Var12;
  _Base_ptr *pp_Var13;
  MessageID *__y;
  MessageID *extraout_RDX;
  MessageID *extraout_RDX_00;
  int ndx;
  long lVar14;
  uint uVar15;
  pointer pMVar16;
  long lVar17;
  undefined1 auVar18 [16];
  allocator_type local_1d9;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *local_1b8;
  pointer local_1b0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  messageIds;
  MessageFilter local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sources;
  Random rng;
  vector<unsigned_int,_std::allocator<unsigned_int>_> severities;
  vector<unsigned_int,_std::allocator<unsigned_int>_> types;
  set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  tempMessageIds;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempSeverities;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempTypes;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempSources;
  
  dVar5 = deStringHash((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  uVar15 = (dVar5 >> 0x10 ^ dVar5 ^ 0x3d) * 9;
  uVar15 = (uVar15 >> 4 ^ uVar15) * 0x27d4eb2d;
  deRandom_init(&rng.m_rnd,uVar15 >> 0xf ^ seed ^ uVar15);
  p_Var1 = &tempMessageIds._M_t._M_impl.super__Rb_tree_header;
  tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tempSources._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tempSources._M_t._M_impl.super__Rb_tree_header._M_header;
  tempSources._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tempSources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tempSources._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tempSources._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tempSources._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tempTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tempTypes._M_t._M_impl.super__Rb_tree_header._M_header;
  tempTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tempTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tempTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tempTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tempTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tempSeverities._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tempSeverities._M_t._M_impl.super__Rb_tree_header._M_header;
  tempSeverities._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tempSeverities._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tempSeverities._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tempSeverities._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tempSeverities._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar16 = (messages->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar8 = (messages->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar16 == pMVar8) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector(__return_storage_ptr__,initial);
  }
  else {
    lVar14 = 0;
    local_1b8 = initial;
    while( true ) {
      p_Var12 = tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      __y = (MessageID *)(((long)pMVar8 - (long)pMVar16) % 0x30);
      if ((int)(((long)pMVar8 - (long)pMVar16) / 0x30) <= lVar14) break;
      pMVar16 = pMVar16 + lVar14;
      bVar4 = true;
      pp_Var13 = &tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 = &p_Var1->_M_header;
      while (auVar18._8_8_ = __y, auVar18._0_8_ = p_Var12, p_Var10 = *pp_Var13,
            p_Var10 != (_Base_ptr)0x0) {
        bVar4 = std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>::operator()
                          ((less<deqp::gles31::Functional::(anonymous_namespace)::MessageID> *)
                           pMVar16,(MessageID *)(p_Var10 + 1),__y);
        __y = extraout_RDX;
        p_Var12 = p_Var10;
        pp_Var13 = &p_Var10->_M_left + !bVar4;
      }
      if (bVar4 == false) {
LAB_011d0937:
        bVar4 = std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>::operator()
                          ((less<deqp::gles31::Functional::(anonymous_namespace)::MessageID> *)
                           (auVar18._0_8_ + 0x20),&pMVar16->id,auVar18._8_8_);
        __y = extraout_RDX_00;
        if (bVar4) goto LAB_011d0947;
      }
      else {
        if (p_Var12 != tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
          auVar18 = std::_Rb_tree_decrement(p_Var12);
          goto LAB_011d0937;
        }
LAB_011d0947:
        if (p_Var1 == (_Rb_tree_header *)p_Var12) {
          bVar4 = true;
        }
        else {
          bVar4 = std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>::operator()
                            ((less<deqp::gles31::Functional::(anonymous_namespace)::MessageID> *)
                             pMVar16,(MessageID *)(p_Var12 + 1),__y);
        }
        p_Var9 = (_Rb_tree_node_base *)operator_new(0x30);
        *(GLuint *)&p_Var9[1]._M_parent = (pMVar16->id).id;
        GVar2 = (pMVar16->id).type;
        p_Var9[1]._M_color = (pMVar16->id).source;
        *(GLenum *)&p_Var9[1].field_0x4 = GVar2;
        std::_Rb_tree_insert_and_rebalance(bVar4,p_Var9,p_Var12,&p_Var1->_M_header);
        tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_node_count =
             tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      }
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&tempSources,(uint *)pMVar16);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&tempTypes,&(pMVar16->id).type);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&tempSeverities,&pMVar16->severity);
      lVar14 = lVar14 + 1;
      pMVar16 = (messages->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pMVar8 = (messages->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    messageIds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    messageIds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    messageIds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar17 = 0;
    lVar14 = 0;
    p_Var10 = tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var10 != p_Var1) {
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      lVar14 = lVar14 + -0xc;
      lVar17 = lVar17 + -1;
    }
    if (0xaaaaaaaaaaaaaaa < (ulong)-lVar17) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    if (lVar17 == 0) {
      local_1b0 = (pointer)0x0;
    }
    else {
      local_1b0 = (pointer)operator_new(-lVar14);
    }
    messageIds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)local_1b0 - lVar14);
    lVar14 = 0;
    messageIds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
    ._M_impl.super__Vector_impl_data._M_start = local_1b0;
    while (pMVar11 = (pointer)((long)&local_1b0->source + lVar14),
          (_Rb_tree_header *)p_Var12 != p_Var1) {
      pMVar11->id = *(GLuint *)&p_Var12[1]._M_parent;
      uVar3 = *(undefined4 *)&p_Var12[1].field_0x4;
      pMVar11->source = p_Var12[1]._M_color;
      pMVar11->type = uVar3;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      lVar14 = lVar14 + 0xc;
    }
    messageIds.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar11;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&sources,
               (_Rb_tree_const_iterator<unsigned_int>)
               tempSources._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<unsigned_int>)
               &tempSources._M_t._M_impl.super__Rb_tree_header,(allocator_type *)&local_178);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&types,
               (_Rb_tree_const_iterator<unsigned_int>)
               tempTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<unsigned_int>)&tempTypes._M_t._M_impl.super__Rb_tree_header,
               (allocator_type *)&local_178);
    __x = local_1b8;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&severities,
               (_Rb_tree_const_iterator<unsigned_int>)
               tempSeverities._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<unsigned_int>)
               &tempSeverities._M_t._M_impl.super__Rb_tree_header,(allocator_type *)&local_178);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector(__return_storage_ptr__,__x);
    local_1b8 = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)(lVar14 / 0xc);
    iVar6 = 0;
    while( true ) {
      if (iVar6 == 4) break;
      dVar5 = deRandom_getUint32(&rng.m_rnd);
      uVar15 = dVar5 % 9;
      if (uVar15 == 0) {
        iVar7 = de::Random::getInt((Random *)&rng.m_rnd,0,
                                   (int)((ulong)((long)sources.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)sources.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) +
                                   -1);
        GVar2 = sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7];
        bVar4 = de::Random::getBool((Random *)&rng.m_rnd);
        local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        MessageFilter::MessageFilter
                  (&local_178,GVar2,0x1100,0x1100,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d8,bVar4);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
        ::push_back(__return_storage_ptr__,&local_178);
LAB_011d0c9a:
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&local_178.ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1d8);
      }
      else {
        if (uVar15 == 1) {
          dVar5 = deRandom_getUint32(&rng.m_rnd);
          GVar2 = types.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(ulong)dVar5 %
                   (ulong)((long)types.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)types.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2)];
          bVar4 = de::Random::getBool((Random *)&rng.m_rnd);
          local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          MessageFilter::MessageFilter
                    (&local_178,0x1100,GVar2,0x1100,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d8,bVar4);
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,&local_178);
          goto LAB_011d0c9a;
        }
        if (uVar15 == 2) {
          dVar5 = deRandom_getUint32(&rng.m_rnd);
          GVar2 = severities.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start
                  [(ulong)dVar5 %
                   (ulong)((long)severities.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)severities.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2)];
          bVar4 = de::Random::getBool((Random *)&rng.m_rnd);
          local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          MessageFilter::MessageFilter
                    (&local_178,0x1100,0x1100,GVar2,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d8,bVar4);
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,&local_178);
          goto LAB_011d0c9a;
        }
        iVar7 = de::Random::getInt((Random *)&rng.m_rnd,0,(int)local_1b8);
        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
          bVar4 = de::Random::getBool(&rng);
          pMVar11 = local_1b0 + (ulong)(long)(iVar7 + (int)lVar14) % (ulong)local_1b8;
          GVar2 = pMVar11->source;
          type_ = pMVar11->type;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d8,1,
                     &pMVar11->id,&local_1d9);
          MessageFilter::MessageFilter
                    (&local_178,GVar2,type_,0x1100,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d8,bVar4);
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,&local_178);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&local_178.ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
          ;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1d8);
        }
      }
      iVar6 = iVar6 + 1;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&severities.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&types.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
    ::~_Vector_base(&messageIds.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                   );
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&tempSeverities._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&tempTypes._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&tempSources._M_t);
  std::
  set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  ::~set(&tempMessageIds);
  return __return_storage_ptr__;
}

Assistant:

vector<FilterCase::MessageFilter> FilterCase::genFilters (const vector<MessageData>& messages, const vector<MessageFilter>& initial, deUint32 seed, int iterations) const
{
	de::Random				rng				(seed ^ deInt32Hash(deStringHash(getName())));

	set<MessageID>			tempMessageIds;
	set<GLenum>				tempSources;
	set<GLenum>				tempTypes;
	set<GLenum>				tempSeverities;

	if (messages.empty())
		return initial;

	for (int ndx = 0; ndx < int(messages.size()); ndx++)
	{
		const MessageData& msg = messages[ndx];

		tempMessageIds.insert(msg.id);
		tempSources.insert(msg.id.source);
		tempTypes.insert(msg.id.type);
		tempSeverities.insert(msg.severity);
	}

	{
		// Fetchable by index
		const vector<MessageID> messageIds	(tempMessageIds.begin(), tempMessageIds.end());
		const vector<GLenum>	sources		(tempSources.begin(), tempSources.end());
		const vector<GLenum>	types		(tempTypes.begin(), tempTypes.end());
		const vector<GLenum>	severities	(tempSeverities.begin(), tempSeverities.end());

		vector<MessageFilter>	filters		= initial;

		for (int iteration = 0; iteration < iterations; iteration++)
		{
			switch(rng.getInt(0, 8)) // Distribute so that per-message randomization (the default branch) is prevalent
			{
				case 0:
				{
					const GLenum	source	= sources[rng.getInt(0, int(sources.size()-1))];
					const bool		enabled	= rng.getBool();

					filters.push_back(MessageFilter(source, GL_DONT_CARE, GL_DONT_CARE, vector<GLuint>(), enabled));
					break;
				}

				case 1:
				{
					const GLenum	type	= types[rng.getUint32()%types.size()];
					const bool		enabled	= rng.getBool();

					filters.push_back(MessageFilter(GL_DONT_CARE, type, GL_DONT_CARE, vector<GLuint>(), enabled));
					break;
				}

				case 2:
				{
					const GLenum	severity	= severities[rng.getUint32()%severities.size()];
					const bool		enabled		= rng.getBool();

					filters.push_back(MessageFilter(GL_DONT_CARE, GL_DONT_CARE, severity, vector<GLuint>(), enabled));
					break;
				}

				default:
				{
					const int start = rng.getInt(0, int(messageIds.size()));

					for (int itr = 0; itr < 4; itr++)
					{
						const MessageID&	id		= messageIds[(start+itr)%messageIds.size()];
						const bool			enabled = rng.getBool();

						filters.push_back(MessageFilter(id.source, id.type, GL_DONT_CARE, vector<GLuint>(1, id.id), enabled));
					}
				}
			}
		}

		return filters;
	}
}